

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O0

StringStream<4096ul,4096ul> * __thiscall
spirv_cross::StringStream<4096ul,4096ul>::str_abi_cxx11_(StringStream<4096ul,4096ul> *this)

{
  undefined8 *in_RSI;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  const_iterator local_98;
  char *local_90;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  const_iterator local_80;
  Buffer *local_78;
  Buffer *saved_1;
  Buffer *__end0_1;
  Buffer *__begin0_1;
  SmallVector<spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL> *__range2_1;
  Buffer *local_48;
  Buffer *saved;
  Buffer *__end0;
  Buffer *__begin0;
  SmallVector<spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL> *__range2;
  size_t target_size;
  StringStream<4096UL,_4096UL> *this_local;
  string *ret;
  
  target_size._7_1_ = 0;
  this_local = (StringStream<4096UL,_4096UL> *)this;
  ::std::__cxx11::string::string((string *)this);
  __range2 = (SmallVector<spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL> *)0x0;
  __begin0 = (Buffer *)(in_RSI + 0x203);
  __end0 = VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>::begin
                     ((VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer> *)__begin0);
  saved = VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>::end
                    ((VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer> *)__begin0);
  for (; __end0 != saved; __end0 = __end0 + 1) {
    local_48 = __end0;
    __range2 = (SmallVector<spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL> *)
               ((__range2->stack_storage).aligned_char + (__end0->offset - 0x18));
  }
  __range2 = (SmallVector<spirv_cross::StringStream<4096UL,_4096UL>::Buffer,_8UL> *)
             ((__range2->stack_storage).aligned_char + in_RSI[1] + -0x18);
  ::std::__cxx11::string::reserve((ulong)this);
  __begin0_1 = (Buffer *)(in_RSI + 0x203);
  __end0_1 = VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>::begin
                       ((VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer> *)__begin0_1)
  ;
  saved_1 = VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer>::end
                      ((VectorView<spirv_cross::StringStream<4096UL,_4096UL>::Buffer> *)__begin0_1);
  for (; __end0_1 != saved_1; __end0_1 = __end0_1 + 1) {
    local_78 = __end0_1;
    local_88._M_current = (char *)::std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_80,&local_88);
    local_90 = (char *)::std::__cxx11::string::insert<char*,void>
                                 ((string *)this,local_80,local_78->buffer,
                                  local_78->buffer + local_78->offset);
  }
  local_a0._M_current = (char *)::std::__cxx11::string::end();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_98,&local_a0);
  ::std::__cxx11::string::insert<char*,void>
            ((string *)this,local_98,(char *)*in_RSI,(char *)*in_RSI + in_RSI[1]);
  return this;
}

Assistant:

std::string str() const
	{
		std::string ret;
		size_t target_size = 0;
		for (auto &saved : saved_buffers)
			target_size += saved.offset;
		target_size += current_buffer.offset;
		ret.reserve(target_size);

		for (auto &saved : saved_buffers)
			ret.insert(ret.end(), saved.buffer, saved.buffer + saved.offset);
		ret.insert(ret.end(), current_buffer.buffer, current_buffer.buffer + current_buffer.offset);
		return ret;
	}